

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::mark_clauses_to_be_flushed(Internal *this)

{
  int64_t *piVar1;
  uint uVar2;
  pointer ppCVar3;
  Clause *c_00;
  Clause **c;
  pointer ppCVar4;
  
  ppCVar3 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (this->clauses).
                 super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar3; ppCVar4 = ppCVar4 + 1) {
    c_00 = *ppCVar4;
    uVar2 = *(uint *)&c_00->field_0x8;
    if ((uVar2 & 0xc10) == 0x800) {
      if ((uVar2 & 0xc000) == 0) {
        mark_garbage(this,c_00);
        if (((*ppCVar4)->field_0x8 & 0x40) == 0) {
          piVar1 = &(this->stats).flush.learned;
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = &(this->stats).flush.hyper;
          *piVar1 = *piVar1 + 1;
        }
      }
      else {
        *(uint *)&c_00->field_0x8 = uVar2 & 0xffff3bef | uVar2 + 0xc000 & 0xc000;
      }
    }
  }
  return;
}

Assistant:

void Internal::mark_clauses_to_be_flushed () {
  for (const auto &c : clauses) {
    if (!c->redundant)
      continue; // keep irredundant
    if (c->garbage)
      continue; // already marked as garbage
    if (c->reason)
      continue; // need to keep reasons
    const unsigned used = c->used;
    if (used)
      c->used--;
    if (used)
      continue;       // but keep recently used clauses
    mark_garbage (c); // flush unused clauses
    if (c->hyper)
      stats.flush.hyper++;
    else
      stats.flush.learned++;
  }
  // No change to 'lim.kept{size,glue}'.
}